

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNSubdivPatch1BuilderSAH<4>::build(BVHNSubdivPatch1BuilderSAH<4> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BVHN<4> *this_00;
  Geometry *pGVar3;
  PrimRef *pPVar4;
  MemoryMonitorInterface *pMVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  Settings settings;
  char cVar25;
  int iVar26;
  long *plVar27;
  ulong uVar28;
  PrimRef *pPVar29;
  NodeRef root;
  runtime_error *prVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  ulong uVar32;
  ulong uVar33;
  unsigned_long uVar34;
  long lVar35;
  ulong *puVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar37;
  size_t sVar38;
  EVP_PKEY_CTX *ctx;
  ulong uVar39;
  BVH *this_01;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  size_t *psVar45;
  size_t sVar46;
  ulong uVar47;
  size_t taskCount;
  Iterator<embree::SubdivMesh,_false> iter;
  string __str;
  ProgressMonitorClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_subdiv_cpp:92:25)>
  virtualprogress;
  PrimInfo pinfo;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  anon_class_1_0_00000001 local_2db2;
  auto_partitioner local_2db1;
  unsigned_long local_2db0;
  BVHNSubdivPatch1BuilderSAH<4> *local_2da8;
  Iterator<embree::GridMesh,_false> local_2da0;
  anon_class_8_1_4d25ca37_conflict local_2d90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_2d78;
  float fStack_2d68;
  float fStack_2d64;
  float fStack_2d60;
  float fStack_2d5c;
  float fStack_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  undefined1 local_2d48 [16];
  size_t *local_2d30;
  double local_2d28;
  anon_class_16_2_341d598e_conflict1 local_2d20;
  anon_class_8_1_898bcfc2_conflict7 local_2d10;
  BuildProgressMonitor local_2d08;
  BVHNSubdivPatch1BuilderSAH<4> *local_2d00;
  anon_class_48_6_afa08d2e_conflict1 local_2cf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2cc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2cb8;
  undefined1 local_2ca8 [16];
  undefined1 local_2c98 [16];
  long local_2c88;
  ulong local_2c80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c38 [31];
  ulong local_2a48 [64];
  ulong local_2848;
  ulong local_2840;
  ulong local_13f0 [632];
  
  sVar46 = (this->scene->world).numSubdivPatches;
  if (sVar46 == 0) {
    if ((this->prims).size_active != 0) {
      (this->prims).size_active = 0;
    }
    (this->prims).size_active = 0;
    this_01 = this->bvh;
    paVar37 = &local_2c48;
    goto LAB_01453ac8;
  }
  this_00 = this->bvh;
  local_2d88._0_8_ = &aStack_2d78;
  std::__cxx11::string::_M_construct((ulong)&local_2d88,'\x01');
  *(undefined1 *)local_2d88._0_8_ = 0x34;
  plVar27 = (long *)std::__cxx11::string::replace((ulong)&local_2d88,0,(char *)0x0,0x1fb0eed);
  paVar37 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(plVar27 + 2);
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar27 == paVar37) {
    local_2cb8 = *paVar37;
    local_2cc8._0_8_ = &local_2cb8;
  }
  else {
    local_2cb8._0_8_ = *(long *)paVar37;
    local_2cc8._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar27;
  }
  local_2cc8._8_8_ = plVar27[1];
  *plVar27 = (long)paVar37;
  plVar27[1] = 0;
  *(undefined1 *)(plVar27 + 2) = 0;
  plVar27 = (long *)std::__cxx11::string::append((char *)&local_2cc8);
  paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar27 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar27 == paVar31) {
    local_2c38[0]._0_8_ = paVar31->_M_allocated_capacity;
    local_2c38[0]._8_8_ = plVar27[3];
    local_2c48._0_8_ = local_2c38;
  }
  else {
    local_2c38[0]._0_8_ = paVar31->_M_allocated_capacity;
    local_2c48._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar27;
  }
  local_2c48._8_8_ = plVar27[1];
  *plVar27 = (long)paVar31;
  plVar27[1] = 0;
  *(undefined1 *)(plVar27 + 2) = 0;
  local_2d28 = BVHN<4>::preBuild(this_00,(string *)&local_2c48.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c48._0_8_ != local_2c38) {
    operator_delete((void *)local_2c48._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_2cc8._0_8_ != &local_2cb8) {
    operator_delete((void *)local_2cc8._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_2d88._0_8_ != &aStack_2d78) {
    operator_delete((void *)local_2d88._0_8_);
  }
  FastAllocator::init_estimate(&this->bvh->alloc,sVar46 << 5);
  local_2d08._vptr_BuildProgressMonitor = (_func_int **)&PTR_operator___0219da10;
  local_2848 = 0;
  local_2da0.scene = this->scene;
  local_2da0.all = false;
  sVar46 = ((local_2da0.scene)->geometries).size_active;
  if (sVar46 == 0) {
    uVar43 = 0;
  }
  else {
    uVar43 = 0;
    sVar38 = 0;
    do {
      pGVar3 = ((local_2da0.scene)->geometries).items[sVar38].ptr;
      if (((pGVar3 == (Geometry *)0x0) || (((uint)pGVar3->field_8 & 0x2000ff) != 0x200017)) ||
         (pGVar3->numTimeSteps != 1)) {
        uVar32 = 0;
      }
      else {
        uVar32 = (ulong)pGVar3->numPrimitives;
      }
      uVar43 = uVar43 + uVar32;
      sVar38 = sVar38 + 1;
    } while (sVar46 != sVar38);
  }
  local_2d00 = this;
  local_2840 = uVar43;
  iVar26 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar32 = uVar43 + 0x3ff >> 10;
  if ((ulong)(long)iVar26 < uVar32) {
    uVar32 = (long)iVar26;
  }
  uVar44 = 0x40;
  if (uVar32 < 0x40) {
    uVar44 = uVar32;
  }
  uVar44 = uVar44 + (uVar44 == 0);
  local_2c48._0_8_ = 0;
  local_2a48[0] = 0;
  local_2848 = uVar44;
  if (1 < uVar32) {
    uVar42 = 0;
    uVar32 = uVar43 / uVar44;
    uVar39 = 1;
    lVar40 = 0;
    do {
      pGVar3 = ((local_2da0.scene)->geometries).items[lVar40].ptr;
      if (((pGVar3 == (Geometry *)0x0) ||
          ((SUB41(pGVar3->field_8,0) == '\x17' &
           ((byte)((uint)pGVar3->field_8 >> 0x15) | local_2da0.all)) != 1)) ||
         ((pGVar3->numTimeSteps != 1 || (uVar41 = (ulong)pGVar3->numPrimitives, uVar41 == 0)))) {
        uVar41 = 0;
        lVar35 = 0;
      }
      else {
        uVar33 = (uVar39 + 1) * uVar43;
        lVar35 = 0;
        uVar47 = 0;
        do {
          uVar28 = uVar32;
          uVar32 = uVar28;
          if ((uVar42 + uVar41 + lVar35 < uVar28) || (uVar44 <= uVar39)) break;
          *(long *)((long)&local_2c48 + uVar39 * 8) = lVar40;
          uVar47 = uVar47 + (uVar28 - uVar42);
          local_2a48[uVar39] = uVar47;
          uVar39 = uVar39 + 1;
          uVar32 = uVar33 / local_2848;
          lVar35 = -uVar47;
          uVar33 = uVar33 + uVar43;
          uVar42 = uVar28;
          uVar44 = local_2848;
        } while (uVar47 < uVar41);
      }
      uVar42 = uVar41 + uVar42 + lVar35;
      lVar40 = lVar40 + 1;
    } while (uVar39 < uVar44);
  }
  local_2d88.m128[0] = INFINITY;
  local_2d88.m128[1] = INFINITY;
  local_2d88.m128[2] = INFINITY;
  local_2d88.m128[3] = INFINITY;
  aStack_2d78.m128[0] = -INFINITY;
  aStack_2d78.m128[1] = -INFINITY;
  aStack_2d78.m128[2] = -INFINITY;
  aStack_2d78.m128[3] = -INFINITY;
  fStack_2d68 = INFINITY;
  fStack_2d64 = INFINITY;
  fStack_2d60 = INFINITY;
  fStack_2d5c = INFINITY;
  fStack_2d58 = -INFINITY;
  fStack_2d54 = -INFINITY;
  fStack_2d50 = -INFINITY;
  fStack_2d4c = -INFINITY;
  local_2d48 = ZEXT816(0) << 0x20;
  local_2d90.array2 = &local_2da0;
  local_2cf8.getSize = &local_2d90;
  local_2d20.func = (anon_class_1_0_00000001 *)&local_2db1;
  local_2cf8.func = &local_2d20;
  local_2cf8.taskCount = &local_2db0;
  local_2cf8.state =
       (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
       &local_2c48;
  local_2cf8.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_2d88;
  local_2cf8.reduction = &local_2db2;
  local_2cc8._12_2_ = 0x401;
  local_2c88 = 8;
  local_2db0 = uVar44;
  local_2d20.array2 = local_2d90.array2;
  local_2ca8 = local_2d48;
  tbb::detail::r1::initialize((task_group_context *)&local_2cc8.field_1);
  local_2d10.func = &local_2cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar44,1,&local_2d10,(auto_partitioner *)&local_2da8,
             (task_group_context *)&local_2cc8.field_1);
  cVar25 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_2cc8.field_1);
  if (cVar25 != '\0') {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar30,"task cancelled");
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)&local_2cc8.field_1);
  uVar43 = local_2d48._0_8_;
  uVar32 = local_2d48._8_8_;
  if (local_2db0 != 0) {
    puVar36 = local_13f0;
    uVar34 = local_2db0;
    uVar7 = local_2d88.m128[0];
    uVar8 = local_2d88.m128[1];
    uVar9 = local_2d88.m128[2];
    uVar10 = local_2d88.m128[3];
    fVar6 = fStack_2d68;
    fVar11 = fStack_2d64;
    fVar12 = fStack_2d60;
    fVar13 = fStack_2d5c;
    uVar14 = aStack_2d78.m128[0];
    uVar15 = aStack_2d78.m128[1];
    uVar16 = aStack_2d78.m128[2];
    uVar17 = aStack_2d78.m128[3];
    fVar18 = fStack_2d58;
    fVar19 = fStack_2d54;
    fVar20 = fStack_2d50;
    fVar21 = fStack_2d4c;
    do {
      *(undefined4 *)(puVar36 + -9) = uVar7;
      *(undefined4 *)((long)puVar36 + -0x44) = uVar8;
      *(undefined4 *)(puVar36 + -8) = uVar9;
      *(undefined4 *)((long)puVar36 + -0x3c) = uVar10;
      *(undefined4 *)(puVar36 + -7) = uVar14;
      *(undefined4 *)((long)puVar36 + -0x34) = uVar15;
      *(undefined4 *)(puVar36 + -6) = uVar16;
      *(undefined4 *)((long)puVar36 + -0x2c) = uVar17;
      *(float *)(puVar36 + -5) = fVar6;
      *(float *)((long)puVar36 + -0x24) = fVar11;
      *(float *)(puVar36 + -4) = fVar12;
      *(float *)((long)puVar36 + -0x1c) = fVar13;
      *(float *)(puVar36 + -3) = fVar18;
      *(float *)((long)puVar36 + -0x14) = fVar19;
      *(float *)(puVar36 + -2) = fVar20;
      *(float *)((long)puVar36 + -0xc) = fVar21;
      puVar36[-1] = uVar43;
      *puVar36 = uVar32;
      uVar43 = uVar43 + puVar36[-0x281];
      uVar32 = uVar32 + puVar36[-0x280];
      puVar36 = puVar36 + 10;
      uVar34 = uVar34 - 1;
      uVar7 = INFINITY;
      uVar8 = INFINITY;
      uVar9 = INFINITY;
      uVar10 = INFINITY;
      fVar6 = INFINITY;
      fVar11 = INFINITY;
      fVar12 = INFINITY;
      fVar13 = INFINITY;
      uVar14 = -INFINITY;
      uVar15 = -INFINITY;
      uVar16 = -INFINITY;
      uVar17 = -INFINITY;
      fVar18 = -INFINITY;
      fVar19 = -INFINITY;
      fVar20 = -INFINITY;
      fVar21 = -INFINITY;
    } while (uVar34 != 0);
  }
  if (uVar43 != 0) {
    uVar43 = (this->prims).size_alloced;
    uVar44 = uVar43;
    if ((uVar43 < uVar32) && (uVar44 = uVar32, uVar42 = uVar43, uVar43 != 0)) {
      do {
        uVar44 = uVar42 * 2 + (ulong)(uVar42 * 2 == 0);
        uVar42 = uVar44;
      } while (uVar44 < uVar32);
    }
    psVar45 = &(this->prims).size_active;
    if (uVar32 < (this->prims).size_active) {
      *psVar45 = uVar32;
    }
    if (uVar43 == uVar44) {
      *psVar45 = uVar32;
    }
    else {
      pPVar4 = (this->prims).items;
      local_2d30 = psVar45;
      if (uVar44 == 0) {
        sVar46 = 0;
LAB_0145374e:
        pPVar29 = (PrimRef *)alignedMalloc(sVar46,0x20);
      }
      else {
        pMVar5 = (this->prims).alloc.device;
        sVar46 = uVar44 << 5;
        (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar46,0);
        if (sVar46 < 0x1c00000) goto LAB_0145374e;
        pPVar29 = (PrimRef *)os_malloc(sVar46,&(this->prims).alloc.hugepages);
      }
      (this->prims).items = pPVar29;
      if ((this->prims).size_active == 0) {
        sVar46 = (this->prims).size_alloced;
        if (pPVar4 != (PrimRef *)0x0) goto LAB_01453796;
      }
      else {
        lVar40 = 0;
        uVar43 = 0;
        do {
          puVar2 = (undefined8 *)((long)&(pPVar4->lower).field_0 + lVar40);
          uVar22 = puVar2[1];
          uVar23 = puVar2[2];
          uVar24 = puVar2[3];
          puVar1 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar40);
          *puVar1 = *puVar2;
          puVar1[1] = uVar22;
          puVar1[2] = uVar23;
          puVar1[3] = uVar24;
          uVar43 = uVar43 + 1;
          lVar40 = lVar40 + 0x20;
        } while (uVar43 < (this->prims).size_active);
        sVar46 = (this->prims).size_alloced;
LAB_01453796:
        if (sVar46 << 5 < 0x1c00000) {
          alignedFree(pPVar4);
        }
        else {
          os_free(pPVar4,sVar46 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar46 != 0) {
        pMVar5 = (this->prims).alloc.device;
        (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar46 * -0x20,1);
      }
      (this->prims).size_active = uVar32;
      (this->prims).size_alloced = uVar44;
      psVar45 = local_2d30;
    }
    uVar43 = local_2848;
    if (uVar32 != 0) {
      local_2d88.m128[0] = INFINITY;
      local_2d88.m128[1] = INFINITY;
      local_2d88.m128[2] = INFINITY;
      local_2d88.m128[3] = INFINITY;
      aStack_2d78.m128[0] = -INFINITY;
      aStack_2d78.m128[1] = -INFINITY;
      aStack_2d78.m128[2] = -INFINITY;
      aStack_2d78.m128[3] = -INFINITY;
      fStack_2d68 = INFINITY;
      fStack_2d64 = INFINITY;
      fStack_2d60 = INFINITY;
      fStack_2d5c = INFINITY;
      fStack_2d58 = -INFINITY;
      fStack_2d54 = -INFINITY;
      fStack_2d50 = -INFINITY;
      fStack_2d4c = -INFINITY;
      local_2d48 = ZEXT816(0) << 0x20;
      local_2d90.array2 = &local_2da0;
      local_2d20.func = (anon_class_1_0_00000001 *)&local_2da8;
      local_2db0 = local_2848;
      local_2cf8.state =
           (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
           &local_2c48;
      local_2cf8.taskCount = &local_2db0;
      local_2cf8.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_2d88;
      local_2cf8.reduction = &local_2db2;
      local_2cf8.func = &local_2d20;
      local_2cc8._12_2_ = 0x401;
      local_2c88 = 8;
      local_2da8 = this;
      local_2d20.array2 = local_2d90.array2;
      local_2cf8.getSize = &local_2d90;
      local_2ca8 = local_2d48;
      tbb::detail::r1::initialize((task_group_context *)&local_2cc8.field_1);
      local_2d10.func = &local_2cf8;
      tbb::detail::d1::
      parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
                (0,uVar43,1,&local_2d10,&local_2db1,(task_group_context *)&local_2cc8.field_1);
      cVar25 = tbb::detail::r1::is_group_execution_cancelled
                         ((task_group_context *)&local_2cc8.field_1);
      if (cVar25 == '\0') {
        tbb::detail::r1::destroy((task_group_context *)&local_2cc8.field_1);
        local_2cc8.m128[1] = local_2d88.m128[1];
        local_2cc8.m128[0] = local_2d88.m128[0];
        local_2cc8.m128[2] = local_2d88.m128[2];
        local_2cc8.m128[3] = local_2d88.m128[3];
        local_2cb8.m128[1] = aStack_2d78.m128[1];
        local_2cb8.m128[0] = aStack_2d78.m128[0];
        local_2cb8.m128[2] = aStack_2d78.m128[2];
        local_2cb8.m128[3] = aStack_2d78.m128[3];
        local_2ca8._4_4_ = fStack_2d64;
        local_2ca8._0_4_ = fStack_2d68;
        local_2ca8._8_4_ = fStack_2d60;
        local_2ca8._12_4_ = fStack_2d5c;
        local_2c98._4_4_ = fStack_2d54;
        local_2c98._0_4_ = fStack_2d58;
        local_2c98._8_4_ = fStack_2d50;
        local_2c98._12_4_ = fStack_2d4c;
        local_2c80 = local_2d48._8_8_;
        if (local_2db0 != 0) {
          puVar36 = local_13f0;
          uVar34 = local_2db0;
          uVar43 = local_2d48._0_8_;
          do {
            *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
             ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar36 + -9))->m128 = local_2cc8;
            *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
             ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar36 + -7))->m128 = local_2cb8;
            *(undefined1 (*) [16])(puVar36 + -5) = local_2ca8;
            *(undefined1 (*) [16])(puVar36 + -3) = local_2c98;
            puVar36[-1] = uVar43;
            *puVar36 = local_2c80;
            local_2cc8.m128 =
                 (__m128)vminps_avx(local_2cc8.m128,*(undefined1 (*) [16])(puVar36 + -0x289));
            local_2cb8.m128 =
                 (__m128)vmaxps_avx(local_2cb8.m128,*(undefined1 (*) [16])(puVar36 + -0x287));
            local_2ca8 = vminps_avx(local_2ca8,*(undefined1 (*) [16])(puVar36 + -0x285));
            local_2c98 = vmaxps_avx(local_2c98,*(undefined1 (*) [16])(puVar36 + -0x283));
            uVar43 = uVar43 + puVar36[-0x281];
            local_2c80 = local_2c80 + puVar36[-0x280];
            puVar36 = puVar36 + 10;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
        }
        local_2c88 = 0;
        for (aStack_2d78.m128[0] = 4.34403e-44; 4U >> (int)aStack_2d78.m128[0] == 0;
            aStack_2d78.m128[0] = (float)((int)aStack_2d78.m128[0] + -1)) {
        }
        local_2d88.m128[0] = 2.8026e-45;
        local_2d88.m128[1] = 0.0;
        local_2d88.m128[2] = 4.48416e-44;
        local_2d88.m128[3] = 0.0;
        aStack_2d78.m128[1] = (float)((int)aStack_2d78.m128[0] >> 0x1f);
        aStack_2d78.m128[2] = 1.4013e-45;
        aStack_2d78.m128[3] = 0.0;
        fStack_2d68 = 1.4013e-45;
        fStack_2d64 = 0.0;
        fStack_2d60 = 1.0;
        fStack_2d5c = 1.0;
        fStack_2d58 = 1.43493e-42;
        fStack_2d54 = 0.0;
        fStack_2d50 = -NAN;
        fStack_2d4c = -NAN;
        local_2cf8.state =
             (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
             &PTR_createLeaf_0219dad0;
        settings.maxDepth = 0x20;
        settings.branchingFactor = 2;
        settings.logBlockSize = (long)(int)aStack_2d78.m128[0];
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0;
        settings.intCost = 1.0;
        settings.singleThreadThreshold = 0x400;
        settings.primrefarrayalloc = 0xffffffffffffffff;
        root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                         ((BVHNBuilderV *)&local_2cf8,&this->bvh->alloc,&local_2d08,
                          (this->prims).items,(PrimInfo *)&local_2cc8.field_1,settings);
        local_2d88.m128[0] = local_2cc8.m128[0];
        local_2d88.m128[1] = local_2cc8.m128[1];
        local_2d88.m128[2] = local_2cc8.m128[2];
        local_2d88.m128[3] = local_2cc8.m128[3];
        aStack_2d78.m128[0] = local_2cb8.m128[0];
        aStack_2d78.m128[1] = local_2cb8.m128[1];
        aStack_2d78.m128[2] = local_2cb8.m128[2];
        aStack_2d78.m128[3] = local_2cb8.m128[3];
        fStack_2d68 = local_2d88.m128[0];
        fStack_2d64 = local_2d88.m128[1];
        fStack_2d60 = local_2d88.m128[2];
        fStack_2d5c = local_2d88.m128[3];
        fStack_2d58 = aStack_2d78.m128[0];
        fStack_2d54 = aStack_2d78.m128[1];
        fStack_2d50 = aStack_2d78.m128[2];
        fStack_2d4c = aStack_2d78.m128[3];
        BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_2d88.field_1,
                     local_2c80 - local_2c88);
        fVar6 = (float)(local_2c80 - local_2c88) * 0.005;
        uVar43 = (ulong)fVar6;
        ctx = (EVP_PKEY_CTX *)((long)(fVar6 - 9.223372e+18) & (long)uVar43 >> 0x3f | uVar43);
        BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
        if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
          sVar46 = (this->prims).size_alloced;
          pPVar4 = (this->prims).items;
          if (pPVar4 != (PrimRef *)0x0) {
            ctx = (EVP_PKEY_CTX *)(sVar46 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pPVar4);
            }
            else {
              os_free(pPVar4,(size_t)ctx,(this->prims).alloc.hugepages);
            }
          }
          if (sVar46 != 0) {
            pMVar5 = (this->prims).alloc.device;
            ctx = (EVP_PKEY_CTX *)(sVar46 * -0x20);
            (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,ctx,1);
          }
          *psVar45 = 0;
          psVar45[1] = 0;
          psVar45[2] = 0;
        }
        BVHN<4>::cleanup(this->bvh,ctx);
        BVHN<4>::postBuild(this->bvh,local_2d28);
        return;
      }
      prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar30,"task cancelled");
      __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this_01 = this->bvh;
  paVar37 = &local_2cc8;
LAB_01453ac8:
  (((BBox<embree::Vec3fa> *)&(paVar37->field_1).x)->lower).field_0.m128[0] = INFINITY;
  (paVar37->field_1).y = INFINITY;
  (paVar37->field_1).z = INFINITY;
  (&paVar37->field_1)[1].x = INFINITY;
  (&paVar37->field_1)[1].y = -INFINITY;
  (&paVar37->field_1)[1].z = -INFINITY;
  (&paVar37->field_1)[2].x = -INFINITY;
  (&paVar37->field_1)[2].y = -INFINITY;
  (((BBox<embree::Vec3fa> *)(paVar37->m128 + 8))->lower).field_0.m128[0] = INFINITY;
  paVar37->m128[9] = INFINITY;
  paVar37->m128[10] = INFINITY;
  paVar37->m128[0xb] = INFINITY;
  (((Vec3fa *)(paVar37->m128 + 0xc))->field_0).m128[0] = -INFINITY;
  paVar37->m128[0xd] = -INFINITY;
  paVar37->m128[0xe] = -INFINITY;
  paVar37->m128[0xf] = -INFINITY;
  BVHN<4>::set(this_01,(NodeRef)0x8,(LBBox3fa *)&paVar37->field_1,0);
  return;
}

Assistant:

void build() 
      {
        /* skip build for empty scene */
        const size_t numPrimitives = scene->getNumPrimitives(SubdivMesh::geom_type,false);
        if (numPrimitives == 0) {
          prims.resize(numPrimitives);
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }
 
        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "SubdivPatch1BuilderSAH");

        //bvh->alloc.reset();
        bvh->alloc.init_estimate(numPrimitives*sizeof(PrimRef));

        auto progress = [&] (size_t dn) { bvh->scene->progressMonitor(double(dn)); };
        auto virtualprogress = BuildProgressMonitorFromClosure(progress);

        ParallelForForPrefixSumState<PrimInfo> pstate;
        
        /* initialize allocator and parallel_for_for_prefix_sum */
        Scene::Iterator<SubdivMesh> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfo pinfo1 = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfo
        { 
          size_t p = 0;
          size_t g = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) {          
            if (!mesh->valid(f)) continue;
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              float level[4]; SubdivPatch1Base::computeEdgeLevels(edge_level,subdiv,level);
              Vec2i grid = SubdivPatch1Base::computeGridSize(level);
              size_t num = getNumEagerLeaves(grid.x,grid.y);
              g+=num;
              p++;
            });
          }
          return PrimInfo(p,g,empty);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo(a.begin+b.begin,a.end+b.end,empty); });
        size_t numSubPatches = pinfo1.begin;
        if (numSubPatches == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        prims.resize(pinfo1.end);
        if (pinfo1.end == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        PrimInfo pinfo3 = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo
        {
          Allocator alloc = bvh->alloc.getCachedAllocator();
          
          PrimInfo s(empty);
          for (size_t f=r.begin(); f!=r.end(); ++f) {
            if (!mesh->valid(f)) continue;
            
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              SubdivPatch1Base patch(unsigned(geomID),unsigned(f),subPatch,mesh,0,uv,edge_level,subdiv,VSIZEX);
              size_t num = createEager(patch,scene,mesh,unsigned(f),alloc,&prims[base.end+s.end]);
              assert(num == getNumEagerLeaves(patch.grid_u_res,patch.grid_v_res));
              for (size_t i=0; i<num; i++)
                s.add_center2(prims[base.end+s.end]);
              s.begin++;
            });
          }
          return s;
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a, b); });

        PrimInfo pinfo(0,pinfo3.end,pinfo3);
        
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& range, Allocator alloc) -> NodeRef {
          assert(range.size() == 1);
          size_t leaf = (size_t) prims[range.begin()].ID();
          return NodeRef(leaf);
        };

        /* settings for BVH build */
        GeneralBVHBuilder::Settings settings;
        settings.logBlockSize = bsr(N);
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0f;
        settings.intCost = 1.0f;
        settings.singleThreadThreshold = DEFAULT_SINGLE_THREAD_THRESHOLD;

        NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,createLeaf,virtualprogress,prims.data(),pinfo,settings);
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));
        
	/* clear temporary data for static geometry */
	if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }